

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_CodePrinter.h
# Opt level: O1

void __thiscall choc::text::CodePrinter::Indent::~Indent(Indent *this)

{
  int *piVar1;
  CodePrinter *this_00;
  size_t sVar2;
  char s [2];
  char local_3a [2];
  string local_38;
  
  this_00 = this->owner;
  piVar1 = &this_00->indent;
  *piVar1 = *piVar1 - this->amount;
  if (-1 < *piVar1) {
    local_3a[0] = this->closeBrace;
    if (local_3a[0] != '\0') {
      local_3a[1] = 0;
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      sVar2 = strlen(local_3a);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,local_3a,local_3a + sVar2)
      ;
      append(this_00,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    return;
  }
  soul::throwInternalCompilerError("indent >= 0","addIndent",0xc2);
}

Assistant:

~Indent()
    {
        owner.addIndent (-amount);

        if (closeBrace != 0)
            owner << closeBrace;
    }